

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

wchar_t square_trap_timeout(chunk *c,loc grid,wchar_t t_idx)

{
  trap *ptVar1;
  trap *ptVar2;
  square *psVar3;
  
  psVar3 = square((chunk_conflict *)c,grid);
  ptVar2 = psVar3->trap;
  do {
    ptVar1 = ptVar2;
    if (ptVar1 == (trap *)0x0) {
      return L'\0';
    }
    ptVar2 = ptVar1->next;
  } while (((L'\xffffffff' < t_idx) && ((uint)ptVar1->t_idx != t_idx)) || (ptVar1->timeout == 0));
  return (uint)ptVar1->timeout;
}

Assistant:

int square_trap_timeout(struct chunk *c, struct loc grid, int t_idx)
{
	struct trap *current_trap = square(c, grid)->trap;
	while (current_trap) {
		/* Get the next trap (may be NULL) */
		struct trap *next_trap = current_trap->next;

		/* If called with a specific index, skip others */
		if ((t_idx >= 0) && (t_idx != current_trap->t_idx)) {
			if (!next_trap) break;
			current_trap = next_trap;
			continue;
		}

		/* If the timer is set, return the value */
		if (current_trap->timeout)
			return current_trap->timeout;

		/* Replace with the next trap */
		current_trap = next_trap;
    }

	return 0;
}